

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void expandFormatArguments<char*>(vector<String,_std::allocator<String>_> *data,char **arg)

{
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)local_30,*arg,&local_31);
  std::vector<String,_std::allocator<String>_>::push_back(data,(value_type *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}